

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O0

void __thiscall script_tests::script_CHECKMULTISIG23::test_method(script_CHECKMULTISIG23 *this)

{
  long lVar1;
  span<const_unsigned_char,_18446744073709551615UL> b;
  span<const_unsigned_char,_18446744073709551615UL> b_00;
  span<const_unsigned_char,_18446744073709551615UL> b_01;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  lazy_ostream *keys_00;
  long in_FS_OFFSET;
  CTransaction *in_stack_ffffffffffffea38;
  undefined7 in_stack_ffffffffffffea40;
  undefined1 in_stack_ffffffffffffea47;
  undefined4 in_stack_ffffffffffffea48;
  uint in_stack_ffffffffffffea4c;
  undefined7 in_stack_ffffffffffffea50;
  undefined1 in_stack_ffffffffffffea57;
  GenericTransactionSignatureChecker<CMutableTransaction> *in_stack_ffffffffffffea58;
  CKey *in_stack_ffffffffffffea60;
  const_string *pcVar5;
  undefined4 in_stack_ffffffffffffea68;
  opcodetype in_stack_ffffffffffffea6c;
  CMutableTransaction *in_stack_ffffffffffffea70;
  undefined4 in_stack_ffffffffffffea78;
  undefined4 in_stack_ffffffffffffea7c;
  int in_stack_ffffffffffffea8c;
  CTransaction *in_stack_ffffffffffffea90;
  CScriptWitness *in_stack_ffffffffffffea98;
  undefined7 in_stack_ffffffffffffeaa0;
  undefined1 in_stack_ffffffffffffeaa7;
  vector<CKey,_std::allocator<CKey>_> *in_stack_ffffffffffffeaa8;
  undefined4 in_stack_ffffffffffffeab0;
  undefined4 in_stack_ffffffffffffeab4;
  undefined4 uVar6;
  undefined7 in_stack_ffffffffffffeae0;
  undefined1 in_stack_ffffffffffffeae7;
  lazy_ostream *in_stack_ffffffffffffeae8;
  uint in_stack_ffffffffffffeaf4;
  uint flags;
  CScriptWitness *in_stack_ffffffffffffeaf8;
  CScript *in_stack_ffffffffffffeb00;
  CScript *scriptPubKey;
  undefined7 in_stack_ffffffffffffeb08;
  undefined1 in_stack_ffffffffffffeb0f;
  ScriptError in_stack_ffffffffffffec0c;
  script_CHECKMULTISIG23 *this_local;
  const_string local_1308;
  lazy_ostream local_12f8 [2];
  assertion_result local_12d8 [2];
  const_string local_12a0 [2];
  lazy_ostream local_1280 [4];
  assertion_result local_1238 [2];
  const_string local_1200;
  lazy_ostream local_11f0 [2];
  assertion_result local_11d0 [2];
  const_string local_1198 [2];
  lazy_ostream local_1178 [4];
  assertion_result local_1130 [2];
  const_string local_10f8;
  lazy_ostream local_10e8 [2];
  assertion_result local_10c8 [2];
  const_string local_1090 [2];
  lazy_ostream local_1070 [4];
  assertion_result local_1028;
  undefined8 local_1000;
  const_string local_ff0;
  lazy_ostream local_fe0 [2];
  assertion_result local_fc0 [2];
  const_string local_f88 [2];
  lazy_ostream local_f68 [4];
  assertion_result local_f20 [2];
  const_string local_ee8;
  lazy_ostream local_ed8 [2];
  assertion_result local_eb8 [2];
  const_string local_e80 [2];
  lazy_ostream local_e60 [4];
  assertion_result local_e18 [2];
  const_string local_de0;
  lazy_ostream local_dd0 [2];
  assertion_result local_db0 [2];
  const_string local_d78 [2];
  lazy_ostream local_d58 [4];
  assertion_result local_d10 [2];
  const_string local_cd8;
  lazy_ostream local_cc8 [2];
  assertion_result local_ca8 [2];
  const_string local_c70 [2];
  lazy_ostream local_c50 [4];
  assertion_result local_c08 [2];
  const_string local_bd0;
  lazy_ostream local_bc0 [2];
  assertion_result local_ba0 [2];
  const_string local_b68 [2];
  lazy_ostream local_b48 [4];
  assertion_result local_b00 [2];
  const_string local_ac8;
  lazy_ostream local_ab8 [2];
  assertion_result local_a98 [2];
  const_string local_a60 [2];
  lazy_ostream local_a40 [4];
  assertion_result local_9f8 [2];
  vector<CKey,_std::allocator<CKey>_> keys;
  CMutableTransaction txTo23;
  CKey key4;
  CKey key3;
  CKey key2;
  CKey key1;
  ScriptError err;
  CScript badsig6;
  CScript badsig5;
  CScript badsig4;
  CScript badsig3;
  CScript badsig2;
  CScript badsig1;
  CScript goodsig3;
  CScript goodsig2;
  CScript goodsig1;
  CTransaction txFrom23;
  CScript scriptPubKey23;
  
  local_1000 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  GenerateRandomKey((bool)in_stack_ffffffffffffea47);
  GenerateRandomKey((bool)in_stack_ffffffffffffea47);
  GenerateRandomKey((bool)in_stack_ffffffffffffea47);
  GenerateRandomKey((bool)in_stack_ffffffffffffea47);
  CScript::CScript((CScript *)in_stack_ffffffffffffea38);
  CScript::operator<<((CScript *)in_stack_ffffffffffffea70,in_stack_ffffffffffffea6c);
  CKey::GetPubKey(in_stack_ffffffffffffea60);
  ToByteVector<CPubKey>((CPubKey *)CONCAT44(in_stack_ffffffffffffea7c,in_stack_ffffffffffffea78));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)
             CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40));
  b._M_extent._M_extent_value._0_4_ = in_stack_ffffffffffffea78;
  b._M_ptr = (pointer)in_stack_ffffffffffffea70;
  b._M_extent._M_extent_value._4_4_ = in_stack_ffffffffffffea7c;
  CScript::operator<<((CScript *)in_stack_ffffffffffffea58,b);
  CKey::GetPubKey(in_stack_ffffffffffffea60);
  ToByteVector<CPubKey>((CPubKey *)CONCAT44(in_stack_ffffffffffffea7c,in_stack_ffffffffffffea78));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)
             CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40));
  b_00._M_extent._M_extent_value._0_4_ = in_stack_ffffffffffffea78;
  b_00._M_ptr = (pointer)in_stack_ffffffffffffea70;
  b_00._M_extent._M_extent_value._4_4_ = in_stack_ffffffffffffea7c;
  CScript::operator<<((CScript *)in_stack_ffffffffffffea58,b_00);
  CKey::GetPubKey(in_stack_ffffffffffffea60);
  ToByteVector<CPubKey>((CPubKey *)CONCAT44(in_stack_ffffffffffffea7c,in_stack_ffffffffffffea78));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)
             CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40));
  b_01._M_extent._M_extent_value._0_4_ = in_stack_ffffffffffffea78;
  b_01._M_ptr = (pointer)in_stack_ffffffffffffea70;
  b_01._M_extent._M_extent_value._4_4_ = in_stack_ffffffffffffea7c;
  CScript::operator<<((CScript *)in_stack_ffffffffffffea58,b_01);
  CScript::operator<<((CScript *)in_stack_ffffffffffffea70,in_stack_ffffffffffffea6c);
  CScript::operator<<((CScript *)in_stack_ffffffffffffea70,in_stack_ffffffffffffea6c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48));
  BuildCreditingTransaction((CScript *)in_stack_ffffffffffffea90,in_stack_ffffffffffffea8c);
  CTransaction::CTransaction
            ((CTransaction *)CONCAT44(in_stack_ffffffffffffea7c,in_stack_ffffffffffffea78),
             in_stack_ffffffffffffea70);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffea38);
  CScript::CScript((CScript *)in_stack_ffffffffffffea38);
  CScriptWitness::CScriptWitness((CScriptWitness *)in_stack_ffffffffffffea38);
  BuildSpendingTransaction
            ((CScript *)CONCAT17(in_stack_ffffffffffffeaa7,in_stack_ffffffffffffeaa0),
             in_stack_ffffffffffffea98,in_stack_ffffffffffffea90);
  CScriptWitness::~CScriptWitness((CScriptWitness *)in_stack_ffffffffffffea38);
  CScript::~CScript((CScript *)in_stack_ffffffffffffea38);
  std::vector<CKey,_std::allocator<CKey>_>::vector
            ((vector<CKey,_std::allocator<CKey>_> *)in_stack_ffffffffffffea38);
  std::vector<CKey,_std::allocator<CKey>_>::push_back
            ((vector<CKey,_std::allocator<CKey>_> *)
             CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
             (value_type *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40));
  std::vector<CKey,_std::allocator<CKey>_>::push_back
            ((vector<CKey,_std::allocator<CKey>_> *)
             CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
             (value_type *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40));
  CTransaction::CTransaction
            ((CTransaction *)CONCAT44(in_stack_ffffffffffffea7c,in_stack_ffffffffffffea78),
             in_stack_ffffffffffffea70);
  sign_multisig((CScript *)CONCAT44(in_stack_ffffffffffffeab4,in_stack_ffffffffffffeab0),
                in_stack_ffffffffffffeaa8,
                (CTransaction *)CONCAT17(in_stack_ffffffffffffeaa7,in_stack_ffffffffffffeaa0));
  CTransaction::~CTransaction(in_stack_ffffffffffffea38);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffea7c,in_stack_ffffffffffffea78),
               (const_string *)in_stack_ffffffffffffea70,
               CONCAT44(in_stack_ffffffffffffea6c,in_stack_ffffffffffffea68),
               (const_string *)in_stack_ffffffffffffea60);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40));
    GenericTransactionSignatureChecker<CMutableTransaction>::GenericTransactionSignatureChecker
              (in_stack_ffffffffffffea58,
               (CMutableTransaction *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
               in_stack_ffffffffffffea4c,
               (CAmount *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (MissingDataBehavior)((ulong)in_stack_ffffffffffffea38 >> 0x20));
    VerifyScript((CScript *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
                 in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8,in_stack_ffffffffffffeaf4,
                 (BaseSignatureChecker *)in_stack_ffffffffffffeae8,
                 (ScriptError *)CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (bool)in_stack_ffffffffffffea47);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (basic_cstring<const_char> *)in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    in_stack_ffffffffffffea38 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_9f8,local_a40,local_a60,0x43a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffea38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38);
    GenericTransactionSignatureChecker<CMutableTransaction>::~GenericTransactionSignatureChecker
              ((GenericTransactionSignatureChecker<CMutableTransaction> *)in_stack_ffffffffffffea38)
    ;
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffea7c,in_stack_ffffffffffffea78),
               (const_string *)in_stack_ffffffffffffea70,
               CONCAT44(in_stack_ffffffffffffea6c,in_stack_ffffffffffffea68),
               (const_string *)in_stack_ffffffffffffea60);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (bool)in_stack_ffffffffffffea47);
    boost::unit_test::lazy_ostream::instance();
    ScriptErrorString_abi_cxx11_(in_stack_ffffffffffffec0c);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    in_stack_ffffffffffffea38 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_a98,local_ab8,&local_ac8,0x43b,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_ffffffffffffea38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffea38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<CKey,_std::allocator<CKey>_>::clear
            ((vector<CKey,_std::allocator<CKey>_> *)in_stack_ffffffffffffea38);
  std::vector<CKey,_std::allocator<CKey>_>::push_back
            ((vector<CKey,_std::allocator<CKey>_> *)
             CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
             (value_type *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40));
  std::vector<CKey,_std::allocator<CKey>_>::push_back
            ((vector<CKey,_std::allocator<CKey>_> *)
             CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
             (value_type *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40));
  CTransaction::CTransaction
            ((CTransaction *)CONCAT44(in_stack_ffffffffffffea7c,in_stack_ffffffffffffea78),
             in_stack_ffffffffffffea70);
  sign_multisig((CScript *)CONCAT44(in_stack_ffffffffffffeab4,in_stack_ffffffffffffeab0),
                in_stack_ffffffffffffeaa8,
                (CTransaction *)CONCAT17(in_stack_ffffffffffffeaa7,in_stack_ffffffffffffeaa0));
  CTransaction::~CTransaction(in_stack_ffffffffffffea38);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffea7c,in_stack_ffffffffffffea78),
               (const_string *)in_stack_ffffffffffffea70,
               CONCAT44(in_stack_ffffffffffffea6c,in_stack_ffffffffffffea68),
               (const_string *)in_stack_ffffffffffffea60);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40));
    GenericTransactionSignatureChecker<CMutableTransaction>::GenericTransactionSignatureChecker
              (in_stack_ffffffffffffea58,
               (CMutableTransaction *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
               in_stack_ffffffffffffea4c,
               (CAmount *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (MissingDataBehavior)((ulong)in_stack_ffffffffffffea38 >> 0x20));
    VerifyScript((CScript *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
                 in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8,in_stack_ffffffffffffeaf4,
                 (BaseSignatureChecker *)in_stack_ffffffffffffeae8,
                 (ScriptError *)CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (bool)in_stack_ffffffffffffea47);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (basic_cstring<const_char> *)in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    in_stack_ffffffffffffea38 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b00,local_b48,local_b68,0x440,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffea38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38);
    GenericTransactionSignatureChecker<CMutableTransaction>::~GenericTransactionSignatureChecker
              ((GenericTransactionSignatureChecker<CMutableTransaction> *)in_stack_ffffffffffffea38)
    ;
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffea7c,in_stack_ffffffffffffea78),
               (const_string *)in_stack_ffffffffffffea70,
               CONCAT44(in_stack_ffffffffffffea6c,in_stack_ffffffffffffea68),
               (const_string *)in_stack_ffffffffffffea60);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (bool)in_stack_ffffffffffffea47);
    boost::unit_test::lazy_ostream::instance();
    ScriptErrorString_abi_cxx11_(in_stack_ffffffffffffec0c);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    in_stack_ffffffffffffea38 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_ba0,local_bc0,&local_bd0,0x441,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_ffffffffffffea38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffea38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
    in_stack_ffffffffffffec0c = CONCAT13(bVar2,(int3)in_stack_ffffffffffffec0c);
  } while (bVar2);
  std::vector<CKey,_std::allocator<CKey>_>::clear
            ((vector<CKey,_std::allocator<CKey>_> *)in_stack_ffffffffffffea38);
  std::vector<CKey,_std::allocator<CKey>_>::push_back
            ((vector<CKey,_std::allocator<CKey>_> *)
             CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
             (value_type *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40));
  std::vector<CKey,_std::allocator<CKey>_>::push_back
            ((vector<CKey,_std::allocator<CKey>_> *)
             CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
             (value_type *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40));
  CTransaction::CTransaction
            ((CTransaction *)CONCAT44(in_stack_ffffffffffffea7c,in_stack_ffffffffffffea78),
             in_stack_ffffffffffffea70);
  sign_multisig((CScript *)CONCAT44(in_stack_ffffffffffffeab4,in_stack_ffffffffffffeab0),
                in_stack_ffffffffffffeaa8,
                (CTransaction *)CONCAT17(in_stack_ffffffffffffeaa7,in_stack_ffffffffffffeaa0));
  CTransaction::~CTransaction(in_stack_ffffffffffffea38);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffea7c,in_stack_ffffffffffffea78),
               (const_string *)in_stack_ffffffffffffea70,
               CONCAT44(in_stack_ffffffffffffea6c,in_stack_ffffffffffffea68),
               (const_string *)in_stack_ffffffffffffea60);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40));
    GenericTransactionSignatureChecker<CMutableTransaction>::GenericTransactionSignatureChecker
              (in_stack_ffffffffffffea58,
               (CMutableTransaction *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
               in_stack_ffffffffffffea4c,
               (CAmount *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (MissingDataBehavior)((ulong)in_stack_ffffffffffffea38 >> 0x20));
    VerifyScript((CScript *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
                 in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8,in_stack_ffffffffffffeaf4,
                 (BaseSignatureChecker *)in_stack_ffffffffffffeae8,
                 (ScriptError *)CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (bool)in_stack_ffffffffffffea47);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (basic_cstring<const_char> *)in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    in_stack_ffffffffffffea38 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c08,local_c50,local_c70,0x446,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffea38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38);
    GenericTransactionSignatureChecker<CMutableTransaction>::~GenericTransactionSignatureChecker
              ((GenericTransactionSignatureChecker<CMutableTransaction> *)in_stack_ffffffffffffea38)
    ;
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffea7c,in_stack_ffffffffffffea78),
               (const_string *)in_stack_ffffffffffffea70,
               CONCAT44(in_stack_ffffffffffffea6c,in_stack_ffffffffffffea68),
               (const_string *)in_stack_ffffffffffffea60);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (bool)in_stack_ffffffffffffea47);
    boost::unit_test::lazy_ostream::instance();
    ScriptErrorString_abi_cxx11_(in_stack_ffffffffffffec0c);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    in_stack_ffffffffffffea38 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_ca8,local_cc8,&local_cd8,0x447,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_ffffffffffffea38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffea38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<CKey,_std::allocator<CKey>_>::clear
            ((vector<CKey,_std::allocator<CKey>_> *)in_stack_ffffffffffffea38);
  std::vector<CKey,_std::allocator<CKey>_>::push_back
            ((vector<CKey,_std::allocator<CKey>_> *)
             CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
             (value_type *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40));
  std::vector<CKey,_std::allocator<CKey>_>::push_back
            ((vector<CKey,_std::allocator<CKey>_> *)
             CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
             (value_type *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40));
  CTransaction::CTransaction
            ((CTransaction *)CONCAT44(in_stack_ffffffffffffea7c,in_stack_ffffffffffffea78),
             in_stack_ffffffffffffea70);
  sign_multisig((CScript *)CONCAT44(in_stack_ffffffffffffeab4,in_stack_ffffffffffffeab0),
                in_stack_ffffffffffffeaa8,
                (CTransaction *)CONCAT17(in_stack_ffffffffffffeaa7,in_stack_ffffffffffffeaa0));
  CTransaction::~CTransaction(in_stack_ffffffffffffea38);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffea7c,in_stack_ffffffffffffea78),
               (const_string *)in_stack_ffffffffffffea70,
               CONCAT44(in_stack_ffffffffffffea6c,in_stack_ffffffffffffea68),
               (const_string *)in_stack_ffffffffffffea60);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40));
    GenericTransactionSignatureChecker<CMutableTransaction>::GenericTransactionSignatureChecker
              (in_stack_ffffffffffffea58,
               (CMutableTransaction *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
               in_stack_ffffffffffffea4c,
               (CAmount *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (MissingDataBehavior)((ulong)in_stack_ffffffffffffea38 >> 0x20));
    VerifyScript((CScript *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
                 in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8,in_stack_ffffffffffffeaf4,
                 (BaseSignatureChecker *)in_stack_ffffffffffffeae8,
                 (ScriptError *)CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (bool)in_stack_ffffffffffffea47);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (basic_cstring<const_char> *)in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    in_stack_ffffffffffffea38 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d10,local_d58,local_d78,0x44c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffea38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38);
    GenericTransactionSignatureChecker<CMutableTransaction>::~GenericTransactionSignatureChecker
              ((GenericTransactionSignatureChecker<CMutableTransaction> *)in_stack_ffffffffffffea38)
    ;
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffea7c,in_stack_ffffffffffffea78),
               (const_string *)in_stack_ffffffffffffea70,
               CONCAT44(in_stack_ffffffffffffea6c,in_stack_ffffffffffffea68),
               (const_string *)in_stack_ffffffffffffea60);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (bool)in_stack_ffffffffffffea47);
    boost::unit_test::lazy_ostream::instance();
    ScriptErrorString_abi_cxx11_(in_stack_ffffffffffffec0c);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    in_stack_ffffffffffffea38 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_db0,local_dd0,&local_de0,0x44d,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_ffffffffffffea38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffea38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<CKey,_std::allocator<CKey>_>::clear
            ((vector<CKey,_std::allocator<CKey>_> *)in_stack_ffffffffffffea38);
  std::vector<CKey,_std::allocator<CKey>_>::push_back
            ((vector<CKey,_std::allocator<CKey>_> *)
             CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
             (value_type *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40));
  std::vector<CKey,_std::allocator<CKey>_>::push_back
            ((vector<CKey,_std::allocator<CKey>_> *)
             CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
             (value_type *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40));
  CTransaction::CTransaction
            ((CTransaction *)CONCAT44(in_stack_ffffffffffffea7c,in_stack_ffffffffffffea78),
             in_stack_ffffffffffffea70);
  sign_multisig((CScript *)CONCAT44(in_stack_ffffffffffffeab4,in_stack_ffffffffffffeab0),
                in_stack_ffffffffffffeaa8,
                (CTransaction *)CONCAT17(in_stack_ffffffffffffeaa7,in_stack_ffffffffffffeaa0));
  CTransaction::~CTransaction(in_stack_ffffffffffffea38);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffea7c,in_stack_ffffffffffffea78),
               (const_string *)in_stack_ffffffffffffea70,
               CONCAT44(in_stack_ffffffffffffea6c,in_stack_ffffffffffffea68),
               (const_string *)in_stack_ffffffffffffea60);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40));
    GenericTransactionSignatureChecker<CMutableTransaction>::GenericTransactionSignatureChecker
              (in_stack_ffffffffffffea58,
               (CMutableTransaction *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
               in_stack_ffffffffffffea4c,
               (CAmount *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (MissingDataBehavior)((ulong)in_stack_ffffffffffffea38 >> 0x20));
    VerifyScript((CScript *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
                 in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8,in_stack_ffffffffffffeaf4,
                 (BaseSignatureChecker *)in_stack_ffffffffffffeae8,
                 (ScriptError *)CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (bool)in_stack_ffffffffffffea47);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (basic_cstring<const_char> *)in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    in_stack_ffffffffffffea38 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e18,local_e60,local_e80,0x452,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffea38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38);
    GenericTransactionSignatureChecker<CMutableTransaction>::~GenericTransactionSignatureChecker
              ((GenericTransactionSignatureChecker<CMutableTransaction> *)in_stack_ffffffffffffea38)
    ;
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffea7c,in_stack_ffffffffffffea78),
               (const_string *)in_stack_ffffffffffffea70,
               CONCAT44(in_stack_ffffffffffffea6c,in_stack_ffffffffffffea68),
               (const_string *)in_stack_ffffffffffffea60);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (bool)in_stack_ffffffffffffea47);
    boost::unit_test::lazy_ostream::instance();
    ScriptErrorString_abi_cxx11_(in_stack_ffffffffffffec0c);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    in_stack_ffffffffffffea38 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_eb8,local_ed8,&local_ee8,0x453,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_ffffffffffffea38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffea38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<CKey,_std::allocator<CKey>_>::clear
            ((vector<CKey,_std::allocator<CKey>_> *)in_stack_ffffffffffffea38);
  std::vector<CKey,_std::allocator<CKey>_>::push_back
            ((vector<CKey,_std::allocator<CKey>_> *)
             CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
             (value_type *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40));
  std::vector<CKey,_std::allocator<CKey>_>::push_back
            ((vector<CKey,_std::allocator<CKey>_> *)
             CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
             (value_type *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40));
  CTransaction::CTransaction
            ((CTransaction *)CONCAT44(in_stack_ffffffffffffea7c,in_stack_ffffffffffffea78),
             in_stack_ffffffffffffea70);
  sign_multisig((CScript *)CONCAT44(in_stack_ffffffffffffeab4,in_stack_ffffffffffffeab0),
                in_stack_ffffffffffffeaa8,
                (CTransaction *)CONCAT17(in_stack_ffffffffffffeaa7,in_stack_ffffffffffffeaa0));
  CTransaction::~CTransaction(in_stack_ffffffffffffea38);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffea7c,in_stack_ffffffffffffea78),
               (const_string *)in_stack_ffffffffffffea70,
               CONCAT44(in_stack_ffffffffffffea6c,in_stack_ffffffffffffea68),
               (const_string *)in_stack_ffffffffffffea60);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40));
    GenericTransactionSignatureChecker<CMutableTransaction>::GenericTransactionSignatureChecker
              (in_stack_ffffffffffffea58,
               (CMutableTransaction *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
               in_stack_ffffffffffffea4c,
               (CAmount *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (MissingDataBehavior)((ulong)in_stack_ffffffffffffea38 >> 0x20));
    VerifyScript((CScript *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
                 in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8,in_stack_ffffffffffffeaf4,
                 (BaseSignatureChecker *)in_stack_ffffffffffffeae8,
                 (ScriptError *)CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (bool)in_stack_ffffffffffffea47);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (basic_cstring<const_char> *)in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    in_stack_ffffffffffffea38 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_f20,local_f68,local_f88,0x458,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffea38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38);
    GenericTransactionSignatureChecker<CMutableTransaction>::~GenericTransactionSignatureChecker
              ((GenericTransactionSignatureChecker<CMutableTransaction> *)in_stack_ffffffffffffea38)
    ;
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffea7c,in_stack_ffffffffffffea78),
               (const_string *)in_stack_ffffffffffffea70,
               CONCAT44(in_stack_ffffffffffffea6c,in_stack_ffffffffffffea68),
               (const_string *)in_stack_ffffffffffffea60);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (bool)in_stack_ffffffffffffea47);
    boost::unit_test::lazy_ostream::instance();
    ScriptErrorString_abi_cxx11_(in_stack_ffffffffffffec0c);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    in_stack_ffffffffffffea38 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_fc0,local_fe0,&local_ff0,0x459,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_ffffffffffffea38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffea38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38);
    uVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar3);
  scriptPubKey = (CScript *)&keys;
  std::vector<CKey,_std::allocator<CKey>_>::clear
            ((vector<CKey,_std::allocator<CKey>_> *)in_stack_ffffffffffffea38);
  std::vector<CKey,_std::allocator<CKey>_>::push_back
            ((vector<CKey,_std::allocator<CKey>_> *)
             CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
             (value_type *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40));
  std::vector<CKey,_std::allocator<CKey>_>::push_back
            ((vector<CKey,_std::allocator<CKey>_> *)
             CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
             (value_type *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40));
  CTransaction::CTransaction
            ((CTransaction *)CONCAT44(in_stack_ffffffffffffea7c,in_stack_ffffffffffffea78),
             in_stack_ffffffffffffea70);
  sign_multisig((CScript *)CONCAT44(in_stack_ffffffffffffeab4,in_stack_ffffffffffffeab0),
                in_stack_ffffffffffffeaa8,
                (CTransaction *)CONCAT17(in_stack_ffffffffffffeaa7,in_stack_ffffffffffffeaa0));
  CTransaction::~CTransaction(in_stack_ffffffffffffea38);
  do {
    pcVar5 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffea7c,in_stack_ffffffffffffea78),
               (const_string *)in_stack_ffffffffffffea70,
               CONCAT44(in_stack_ffffffffffffea6c,in_stack_ffffffffffffea68),
               (const_string *)in_stack_ffffffffffffea60);
    flags = 0;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40));
    GenericTransactionSignatureChecker<CMutableTransaction>::GenericTransactionSignatureChecker
              (in_stack_ffffffffffffea58,
               (CMutableTransaction *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
               in_stack_ffffffffffffea4c,
               (CAmount *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (MissingDataBehavior)((ulong)in_stack_ffffffffffffea38 >> 0x20));
    VerifyScript((CScript *)CONCAT17(uVar3,in_stack_ffffffffffffeb08),scriptPubKey,
                 (CScriptWitness *)pcVar5,flags,(BaseSignatureChecker *)in_stack_ffffffffffffeae8,
                 (ScriptError *)CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (bool)in_stack_ffffffffffffea47);
    in_stack_ffffffffffffeae8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (basic_cstring<const_char> *)in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    in_stack_ffffffffffffea38 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_1028,local_1070,local_1090,0x45e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffea38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38);
    GenericTransactionSignatureChecker<CMutableTransaction>::~GenericTransactionSignatureChecker
              ((GenericTransactionSignatureChecker<CMutableTransaction> *)in_stack_ffffffffffffea38)
    ;
    in_stack_ffffffffffffeae7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffeae7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffea7c,in_stack_ffffffffffffea78),
               (const_string *)in_stack_ffffffffffffea70,
               CONCAT44(in_stack_ffffffffffffea6c,in_stack_ffffffffffffea68),
               (const_string *)in_stack_ffffffffffffea60);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (bool)in_stack_ffffffffffffea47);
    boost::unit_test::lazy_ostream::instance();
    ScriptErrorString_abi_cxx11_(in_stack_ffffffffffffec0c);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    in_stack_ffffffffffffea38 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_10c8,local_10e8,&local_10f8,0x45f,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_ffffffffffffea38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffea38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<CKey,_std::allocator<CKey>_>::clear
            ((vector<CKey,_std::allocator<CKey>_> *)in_stack_ffffffffffffea38);
  std::vector<CKey,_std::allocator<CKey>_>::push_back
            ((vector<CKey,_std::allocator<CKey>_> *)
             CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
             (value_type *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40));
  std::vector<CKey,_std::allocator<CKey>_>::push_back
            ((vector<CKey,_std::allocator<CKey>_> *)
             CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
             (value_type *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40));
  CTransaction::CTransaction
            ((CTransaction *)CONCAT44(in_stack_ffffffffffffea7c,in_stack_ffffffffffffea78),
             in_stack_ffffffffffffea70);
  sign_multisig((CScript *)CONCAT44(in_stack_ffffffffffffeab4,in_stack_ffffffffffffeab0),
                in_stack_ffffffffffffeaa8,
                (CTransaction *)CONCAT17(in_stack_ffffffffffffeaa7,in_stack_ffffffffffffeaa0));
  CTransaction::~CTransaction(in_stack_ffffffffffffea38);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffea7c,in_stack_ffffffffffffea78),
               (const_string *)in_stack_ffffffffffffea70,
               CONCAT44(in_stack_ffffffffffffea6c,in_stack_ffffffffffffea68),
               (const_string *)in_stack_ffffffffffffea60);
    uVar6 = 0;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40));
    GenericTransactionSignatureChecker<CMutableTransaction>::GenericTransactionSignatureChecker
              (in_stack_ffffffffffffea58,
               (CMutableTransaction *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
               in_stack_ffffffffffffea4c,
               (CAmount *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (MissingDataBehavior)((ulong)in_stack_ffffffffffffea38 >> 0x20));
    bVar2 = VerifyScript((CScript *)CONCAT17(uVar3,in_stack_ffffffffffffeb08),scriptPubKey,
                         (CScriptWitness *)pcVar5,flags,
                         (BaseSignatureChecker *)in_stack_ffffffffffffeae8,
                         (ScriptError *)
                         CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
    in_stack_ffffffffffffeab0 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffeab0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (bool)in_stack_ffffffffffffea47);
    keys_00 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (basic_cstring<const_char> *)in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    in_stack_ffffffffffffea38 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1130,local_1178,local_1198,0x464,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffea38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38);
    GenericTransactionSignatureChecker<CMutableTransaction>::~GenericTransactionSignatureChecker
              ((GenericTransactionSignatureChecker<CMutableTransaction> *)in_stack_ffffffffffffea38)
    ;
    uVar4 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar4);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffea7c,in_stack_ffffffffffffea78),
               (const_string *)in_stack_ffffffffffffea70,
               CONCAT44(in_stack_ffffffffffffea6c,in_stack_ffffffffffffea68),
               (const_string *)in_stack_ffffffffffffea60);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (bool)in_stack_ffffffffffffea47);
    boost::unit_test::lazy_ostream::instance();
    ScriptErrorString_abi_cxx11_(in_stack_ffffffffffffec0c);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    in_stack_ffffffffffffea38 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_11d0,local_11f0,&local_1200,0x465,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_ffffffffffffea38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffea38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<CKey,_std::allocator<CKey>_>::clear
            ((vector<CKey,_std::allocator<CKey>_> *)in_stack_ffffffffffffea38);
  CTransaction::CTransaction
            ((CTransaction *)CONCAT44(in_stack_ffffffffffffea7c,in_stack_ffffffffffffea78),
             in_stack_ffffffffffffea70);
  sign_multisig((CScript *)CONCAT44(uVar6,in_stack_ffffffffffffeab0),
                (vector<CKey,_std::allocator<CKey>_> *)keys_00,
                (CTransaction *)CONCAT17(uVar4,in_stack_ffffffffffffeaa0));
  CTransaction::~CTransaction(in_stack_ffffffffffffea38);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffea7c,in_stack_ffffffffffffea78),
               (const_string *)in_stack_ffffffffffffea70,
               CONCAT44(in_stack_ffffffffffffea6c,in_stack_ffffffffffffea68),
               (const_string *)in_stack_ffffffffffffea60);
    in_stack_ffffffffffffea7c = 0;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40));
    GenericTransactionSignatureChecker<CMutableTransaction>::GenericTransactionSignatureChecker
              (in_stack_ffffffffffffea58,
               (CMutableTransaction *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
               in_stack_ffffffffffffea4c,
               (CAmount *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (MissingDataBehavior)((ulong)in_stack_ffffffffffffea38 >> 0x20));
    bVar2 = VerifyScript((CScript *)CONCAT17(uVar3,in_stack_ffffffffffffeb08),scriptPubKey,
                         (CScriptWitness *)pcVar5,flags,
                         (BaseSignatureChecker *)in_stack_ffffffffffffeae8,
                         (ScriptError *)
                         CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
    in_stack_ffffffffffffea78 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffea78);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (bool)in_stack_ffffffffffffea47);
    in_stack_ffffffffffffea70 = (CMutableTransaction *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (basic_cstring<const_char> *)in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    in_stack_ffffffffffffea38 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1238,local_1280,local_12a0,0x469,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffea38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38);
    GenericTransactionSignatureChecker<CMutableTransaction>::~GenericTransactionSignatureChecker
              ((GenericTransactionSignatureChecker<CMutableTransaction> *)in_stack_ffffffffffffea38)
    ;
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
    in_stack_ffffffffffffea6c = CONCAT13(bVar2,(int3)in_stack_ffffffffffffea6c);
  } while (bVar2);
  do {
    pcVar5 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffea7c,in_stack_ffffffffffffea78),
               (const_string *)in_stack_ffffffffffffea70,
               CONCAT44(in_stack_ffffffffffffea6c,in_stack_ffffffffffffea68),pcVar5);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (bool)in_stack_ffffffffffffea47);
    boost::unit_test::lazy_ostream::instance();
    ScriptErrorString_abi_cxx11_(in_stack_ffffffffffffec0c);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffea38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48),
               (pointer)CONCAT17(in_stack_ffffffffffffea47,in_stack_ffffffffffffea40),
               (unsigned_long)in_stack_ffffffffffffea38);
    in_stack_ffffffffffffea38 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_12d8,local_12f8,&local_1308,0x46a,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_ffffffffffffea38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffea38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CScript::~CScript((CScript *)in_stack_ffffffffffffea38);
  CScript::~CScript((CScript *)in_stack_ffffffffffffea38);
  CScript::~CScript((CScript *)in_stack_ffffffffffffea38);
  CScript::~CScript((CScript *)in_stack_ffffffffffffea38);
  CScript::~CScript((CScript *)in_stack_ffffffffffffea38);
  CScript::~CScript((CScript *)in_stack_ffffffffffffea38);
  CScript::~CScript((CScript *)in_stack_ffffffffffffea38);
  CScript::~CScript((CScript *)in_stack_ffffffffffffea38);
  CScript::~CScript((CScript *)in_stack_ffffffffffffea38);
  std::vector<CKey,_std::allocator<CKey>_>::~vector
            ((vector<CKey,_std::allocator<CKey>_> *)
             CONCAT44(in_stack_ffffffffffffea4c,in_stack_ffffffffffffea48));
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffea38);
  CTransaction::~CTransaction(in_stack_ffffffffffffea38);
  CScript::~CScript((CScript *)in_stack_ffffffffffffea38);
  CKey::~CKey((CKey *)in_stack_ffffffffffffea38);
  CKey::~CKey((CKey *)in_stack_ffffffffffffea38);
  CKey::~CKey((CKey *)in_stack_ffffffffffffea38);
  CKey::~CKey((CKey *)in_stack_ffffffffffffea38);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(script_CHECKMULTISIG23)
{
    ScriptError err;
    CKey key1 = GenerateRandomKey();
    CKey key2 = GenerateRandomKey(/*compressed=*/false);
    CKey key3 = GenerateRandomKey();
    CKey key4 = GenerateRandomKey(/*compressed=*/false);

    CScript scriptPubKey23;
    scriptPubKey23 << OP_2 << ToByteVector(key1.GetPubKey()) << ToByteVector(key2.GetPubKey()) << ToByteVector(key3.GetPubKey()) << OP_3 << OP_CHECKMULTISIG;

    const CTransaction txFrom23{BuildCreditingTransaction(scriptPubKey23)};
    CMutableTransaction txTo23 = BuildSpendingTransaction(CScript(), CScriptWitness(), txFrom23);

    std::vector<CKey> keys;
    keys.push_back(key1); keys.push_back(key2);
    CScript goodsig1 = sign_multisig(scriptPubKey23, keys, CTransaction(txTo23));
    BOOST_CHECK(VerifyScript(goodsig1, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));

    keys.clear();
    keys.push_back(key1); keys.push_back(key3);
    CScript goodsig2 = sign_multisig(scriptPubKey23, keys, CTransaction(txTo23));
    BOOST_CHECK(VerifyScript(goodsig2, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));

    keys.clear();
    keys.push_back(key2); keys.push_back(key3);
    CScript goodsig3 = sign_multisig(scriptPubKey23, keys, CTransaction(txTo23));
    BOOST_CHECK(VerifyScript(goodsig3, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));

    keys.clear();
    keys.push_back(key2); keys.push_back(key2); // Can't reuse sig
    CScript badsig1 = sign_multisig(scriptPubKey23, keys, CTransaction(txTo23));
    BOOST_CHECK(!VerifyScript(badsig1, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_EVAL_FALSE, ScriptErrorString(err));

    keys.clear();
    keys.push_back(key2); keys.push_back(key1); // sigs must be in correct order
    CScript badsig2 = sign_multisig(scriptPubKey23, keys, CTransaction(txTo23));
    BOOST_CHECK(!VerifyScript(badsig2, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_EVAL_FALSE, ScriptErrorString(err));

    keys.clear();
    keys.push_back(key3); keys.push_back(key2); // sigs must be in correct order
    CScript badsig3 = sign_multisig(scriptPubKey23, keys, CTransaction(txTo23));
    BOOST_CHECK(!VerifyScript(badsig3, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_EVAL_FALSE, ScriptErrorString(err));

    keys.clear();
    keys.push_back(key4); keys.push_back(key2); // sigs must match pubkeys
    CScript badsig4 = sign_multisig(scriptPubKey23, keys, CTransaction(txTo23));
    BOOST_CHECK(!VerifyScript(badsig4, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_EVAL_FALSE, ScriptErrorString(err));

    keys.clear();
    keys.push_back(key1); keys.push_back(key4); // sigs must match pubkeys
    CScript badsig5 = sign_multisig(scriptPubKey23, keys, CTransaction(txTo23));
    BOOST_CHECK(!VerifyScript(badsig5, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_EVAL_FALSE, ScriptErrorString(err));

    keys.clear(); // Must have signatures
    CScript badsig6 = sign_multisig(scriptPubKey23, keys, CTransaction(txTo23));
    BOOST_CHECK(!VerifyScript(badsig6, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_INVALID_STACK_OPERATION, ScriptErrorString(err));
}